

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 __thiscall simd_test_avx2::c_imm_v128_shl_n_32<1>(simd_test_avx2 *this,c_v128 a)

{
  c_v128 cVar1;
  
  cVar1._8_8_ = a.u64[0] * 2 & 0xfffffffefffffffe;
  cVar1._0_8_ = (long)this * 2 & 0xfffffffefffffffe;
  return cVar1;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shl_32(c_v64 a, unsigned int n) {
  c_v64 t;
  if (SIMD_CHECK && n > 31) {
    fprintf(stderr, "Error: undefined u32 shift left %d\n", n);
    abort();
  }
  t.u32[1] = a.u32[1] << n;
  t.u32[0] = a.u32[0] << n;
  return t;
}